

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O1

int enet_protocol_send_outgoing_commands(ENetHost *host,ENetEvent *event,int checkForTimeouts)

{
  size_t *psVar1;
  ENetList *pEVar2;
  _ENetListNode **pp_Var3;
  byte *pbVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  ENetPeerState EVar7;
  size_t sVar8;
  _ENetListNode *p_Var9;
  _ENetListNode *p_Var10;
  _ENetListNode *p_Var11;
  ENetChecksumCallback p_Var12;
  ENetEvent *pEVar13;
  ushort uVar14;
  uint uVar15;
  uint64_t uVar16;
  ushort uVar17;
  _ENetListNode *p_Var18;
  uint uVar19;
  long lVar20;
  int iVar21;
  ENetListIterator result;
  ENetPeer *peer;
  ulong uVar22;
  uint8_t headerData [12];
  undefined8 local_5c;
  ENetBuffer *local_50;
  _ENetListNode *local_48;
  _ENetListNode *local_40;
  ENetEvent *local_38;
  
  host->continueSending = 1;
  local_48 = &(host->dispatchQueue).sentinel;
  local_50 = host->buffers;
  local_38 = event;
  do {
    host->continueSending = 0;
    if (0 < (long)host->peerCount) {
      peer = host->peers;
      do {
        if ((peer->state != ENET_PEER_STATE_DISCONNECTED) && (peer->state != ENET_PEER_STATE_ZOMBIE)
           ) {
          host->headerFlags = 0;
          host->commandCount = 0;
          host->bufferCount = 1;
          host->packetSize = (ulong)(host->checksumCallback != (ENetChecksumCallback)0x0) * 8 + 4;
          p_Var18 = (peer->acknowledgements).sentinel.next;
          if (p_Var18 != &(peer->acknowledgements).sentinel) {
            lVar20 = 0x6a8;
            uVar22 = 0x8c;
            do {
              if (0x68b < uVar22) {
                lVar20 = 0x8a8;
                uVar22 = 0x68c;
LAB_00103943:
                host->continueSending = 1;
                break;
              }
              sVar8 = host->packetSize;
              if (peer->mtu - sVar8 < 8) goto LAB_00103943;
              p_Var9 = p_Var18->next;
              *(ulong *)((long)&host->socket + lVar20) = (long)&host->socket + uVar22;
              *(undefined8 *)((long)&(host->address).field_0 + lVar20 + 4) = 8;
              host->packetSize = sVar8 + 8;
              uVar14 = *(ushort *)((long)&p_Var18[1].next + 6);
              uVar14 = uVar14 << 8 | uVar14 >> 8;
              *(undefined1 *)((long)&host->socket + uVar22) = 1;
              *(undefined1 *)((long)&host->socket + uVar22 + 1) =
                   *(undefined1 *)((long)&p_Var18[1].next + 5);
              *(ushort *)((long)&host->socket + uVar22 + 2) = uVar14;
              *(ushort *)((long)&(host->address).field_0 + uVar22) = uVar14;
              *(ushort *)((long)&(host->address).field_0 + uVar22 + 2) =
                   *(ushort *)&p_Var18[1].next << 8 | *(ushort *)&p_Var18[1].next >> 8;
              if (((ulong)p_Var18[1].next & 0xf00000000) == 0x400000000) {
                if (peer->state - ENET_PEER_STATE_CONNECTED < 2) {
                  if (peer->incomingBandwidth != 0) {
                    psVar1 = &peer->host->bandwidthLimitedPeers;
                    *psVar1 = *psVar1 - 1;
                  }
                  psVar1 = &peer->host->connectedPeers;
                  *psVar1 = *psVar1 - 1;
                }
                peer->state = ENET_PEER_STATE_ZOMBIE;
                if (peer->needsDispatch == 0) {
                  p_Var10 = (host->dispatchQueue).sentinel.previous;
                  (peer->dispatchList).previous = p_Var10;
                  (peer->dispatchList).next = local_48;
                  p_Var10->next = &peer->dispatchList;
                  (host->dispatchQueue).sentinel.previous = &peer->dispatchList;
                  peer->needsDispatch = 1;
                }
              }
              p_Var10 = p_Var18->previous;
              p_Var10->next = p_Var18->next;
              p_Var18->next->previous = p_Var10;
              (*(code *)callbacks_1)();
              uVar22 = uVar22 + 0x30;
              lVar20 = lVar20 + 0x10;
              p_Var18 = p_Var9;
            } while (p_Var9 != &(peer->acknowledgements).sentinel);
            host->commandCount = ((long)(uVar22 - 0x8c) >> 4) * -0x5555555555555555;
            host->bufferCount = lVar20 + -0x698 >> 4;
          }
          pEVar13 = local_38;
          if (checkForTimeouts != 0) {
            pEVar2 = &peer->sentReliableCommands;
            p_Var18 = (peer->sentReliableCommands).sentinel.next;
            if ((p_Var18 != &pEVar2->sentinel) &&
               (uVar5 = host->serviceTime, uVar5 - peer->nextTimeout < 86400000)) {
              p_Var9 = (peer->outgoingCommands).sentinel.next;
              do {
                p_Var10 = p_Var18->next;
                uVar6 = *(uint32_t *)((long)&p_Var18[1].next + 4);
                uVar15 = uVar6 - uVar5;
                if (uVar5 - uVar6 < 86400000) {
                  uVar15 = uVar5 - uVar6;
                }
                uVar19 = *(uint *)&p_Var18[1].previous;
                if (uVar19 <= uVar15) {
                  if ((peer->earliestTimeout == 0) || (86399999 < uVar6 - peer->earliestTimeout)) {
                    peer->earliestTimeout = uVar6;
                  }
                  uVar6 = peer->earliestTimeout;
                  if (uVar6 != 0) {
                    uVar15 = uVar6 - uVar5;
                    if (uVar5 - uVar6 < 86400000) {
                      uVar15 = uVar5 - uVar6;
                    }
                    if ((peer->timeoutMaximum <= uVar15) ||
                       ((*(uint *)((long)&p_Var18[1].previous + 4) <= uVar19 &&
                        (peer->timeoutMinimum <= uVar15)))) {
                      EVar7 = peer->state;
                      if (ENET_PEER_STATE_ACKNOWLEDGING_CONNECT < EVar7) {
                        host->recalculateBandwidthLimits = 1;
                      }
                      if (EVar7 < ENET_PEER_STATE_CONNECTION_SUCCEEDED &&
                          EVar7 != ENET_PEER_STATE_CONNECTING) {
LAB_00103d47:
                        enet_peer_reset(peer);
                      }
                      else {
                        if (local_38 != (ENetEvent *)0x0) {
                          local_38->type = ENET_EVENT_TYPE_DISCONNECT_TIMEOUT;
                          local_38->peer = peer;
                          local_38->data = 0;
                          goto LAB_00103d47;
                        }
                        peer->eventData = 0;
                        if (EVar7 - ENET_PEER_STATE_CONNECTED < 2) {
                          if (peer->incomingBandwidth != 0) {
                            psVar1 = &peer->host->bandwidthLimitedPeers;
                            *psVar1 = *psVar1 - 1;
                          }
                          psVar1 = &peer->host->connectedPeers;
                          *psVar1 = *psVar1 - 1;
                        }
                        peer->state = ENET_PEER_STATE_ZOMBIE;
                        if (peer->needsDispatch == 0) {
                          p_Var18 = (host->dispatchQueue).sentinel.previous;
                          (peer->dispatchList).previous = p_Var18;
                          (peer->dispatchList).next = local_48;
                          p_Var18->next = &peer->dispatchList;
                          (host->dispatchQueue).sentinel.previous = &peer->dispatchList;
                          peer->needsDispatch = 1;
                        }
                      }
                      if ((pEVar13 != (ENetEvent *)0x0) && (pEVar13->type != ENET_EVENT_TYPE_NONE))
                      {
                        return 1;
                      }
                      goto LAB_00103ced;
                    }
                  }
                  if (p_Var18[5].previous != (_ENetListNode *)0x0) {
                    peer->reliableDataInTransit =
                         peer->reliableDataInTransit - (uint)*(ushort *)((long)&p_Var18[2].next + 4)
                    ;
                  }
                  peer->totalPacketsLost = peer->totalPacketsLost + 1;
                  iVar21 = peer->roundTripTimeVariance * 4 + peer->roundTripTime;
                  *(int *)&p_Var18[1].previous = iVar21;
                  *(uint32_t *)((long)&p_Var18[1].previous + 4) = iVar21 * peer->timeoutLimit;
                  p_Var11 = p_Var18->previous;
                  p_Var11->next = p_Var10;
                  p_Var18->next->previous = p_Var11;
                  p_Var11 = p_Var9->previous;
                  p_Var18->previous = p_Var11;
                  p_Var18->next = p_Var9;
                  p_Var11->next = p_Var18;
                  p_Var9->previous = p_Var18;
                  p_Var18 = (peer->sentReliableCommands).sentinel.next;
                  if (p_Var18 != &pEVar2->sentinel && p_Var10 == p_Var18) {
                    peer->nextTimeout =
                         *(int *)&p_Var10[1].previous + *(int *)((long)&p_Var10[1].next + 4);
                  }
                }
                p_Var18 = p_Var10;
              } while (p_Var10 != &pEVar2->sentinel);
            }
          }
          if ((((peer->outgoingCommands).sentinel.next == &(peer->outgoingCommands).sentinel) ||
              (iVar21 = enet_protocol_check_outgoing_commands(host,peer), iVar21 != 0)) &&
             ((peer->sentReliableCommands).sentinel.next == &(peer->sentReliableCommands).sentinel))
          {
            uVar19 = host->serviceTime - peer->lastReceiveTime;
            uVar15 = peer->lastReceiveTime - host->serviceTime;
            if (uVar19 < 86400000) {
              uVar15 = uVar19;
            }
            if ((peer->pingInterval <= uVar15) && (3 < (ulong)peer->mtu - host->packetSize)) {
              enet_peer_ping(peer);
              enet_protocol_check_outgoing_commands(host,peer);
            }
          }
          if (host->commandCount != 0) {
            host->buffers[0].data = &local_5c;
            uVar15 = *(uint *)&host->headerFlags;
            if ((uVar15 >> 0xe & 1) == 0) {
              host->buffers[0].dataLength = 2;
            }
            else {
              uVar14 = (ushort)host->serviceTime;
              local_5c._2_2_ = uVar14 << 8 | uVar14 >> 8;
              host->buffers[0].dataLength = 4;
            }
            uVar14 = peer->outgoingPeerID;
            if (uVar14 < 0xfff) {
              iVar21._0_1_ = peer->outgoingSessionID;
              iVar21._1_1_ = peer->incomingSessionID;
              iVar21._2_2_ = *(undefined2 *)&peer->field_0x22;
              host->headerFlags = (ushort)uVar15 | (ushort)(iVar21 << 0xc);
            }
            uVar17 = host->headerFlags | uVar14;
            local_5c._0_2_ = uVar17 << 8 | uVar17 >> 8;
            p_Var12 = host->checksumCallback;
            if (p_Var12 != (ENetChecksumCallback)0x0) {
              if (uVar14 < 0xfff) {
                uVar22 = (ulong)peer->connectID;
              }
              else {
                uVar22 = 0;
              }
              sVar8 = host->buffers[0].dataLength;
              *(ulong *)((long)&local_5c + sVar8) = uVar22;
              host->buffers[0].dataLength = sVar8 + 8;
              uVar16 = (*p_Var12)(local_50,(int)host->bufferCount);
              *(uint64_t *)((long)&local_5c + sVar8) = uVar16;
            }
            peer->lastSendTime = host->serviceTime;
            uVar15 = enet_socket_send(host->socket,&peer->address,local_50,host->bufferCount);
            pEVar2 = &peer->sentUnreliableCommands;
            p_Var18 = &(peer->outgoingCommands).sentinel;
            if ((peer->sentUnreliableCommands).sentinel.next != &pEVar2->sentinel) {
              do {
                local_40 = p_Var18;
                p_Var18 = (pEVar2->sentinel).next;
                p_Var9 = p_Var18->previous;
                p_Var9->next = p_Var18->next;
                p_Var18->next->previous = p_Var9;
                p_Var9 = p_Var18[5].previous;
                if (p_Var9 != (_ENetListNode *)0x0) {
                  pp_Var3 = &p_Var9[1].previous;
                  *(int *)pp_Var3 = *(int *)pp_Var3 + -1;
                  if (*(int *)pp_Var3 == 0) {
                    pbVar4 = (byte *)((long)&p_Var9->next + 1);
                    *pbVar4 = *pbVar4 | 1;
                    if (p_Var9[1].next != (_ENetListNode *)0x0) {
                      (*(code *)p_Var9[1].next)(p_Var9);
                    }
                    (*(code *)callbacks_1)(p_Var9);
                  }
                }
                (*(code *)callbacks_1)(p_Var18);
                p_Var18 = local_40;
              } while ((pEVar2->sentinel).next != &pEVar2->sentinel);
              if (((peer->state == ENET_PEER_STATE_DISCONNECT_LATER) &&
                  (((ENetListNode *)&local_40->next)->next == local_40)) &&
                 ((peer->sentReliableCommands).sentinel.next ==
                  &(peer->sentReliableCommands).sentinel)) {
                enet_peer_disconnect(peer,peer->eventData);
              }
            }
            if ((int)uVar15 < 0) {
              return -1;
            }
            host->totalSentData = host->totalSentData + uVar15;
            peer->totalDataSent = peer->totalDataSent + (ulong)uVar15;
            host->totalSentPackets = host->totalSentPackets + 1;
          }
        }
LAB_00103ced:
        peer = peer + 1;
      } while (peer < host->peers + host->peerCount);
    }
    if (host->continueSending == 0) {
      return 0;
    }
  } while( true );
}

Assistant:

static int enet_protocol_send_outgoing_commands(ENetHost* host, ENetEvent* event, int checkForTimeouts) {
	uint8_t headerData[sizeof(ENetProtocolHeader) + sizeof(enet_checksum)];
	ENetProtocolHeader* header = (ENetProtocolHeader*)headerData;
	ENetPeer* currentPeer;
	int sentLength;
	host->continueSending = 1;

	while (host->continueSending) {
		for (host->continueSending = 0, currentPeer = host->peers; currentPeer < &host->peers[host->peerCount]; ++currentPeer) {
			if (currentPeer->state == ENET_PEER_STATE_DISCONNECTED || currentPeer->state == ENET_PEER_STATE_ZOMBIE)
				continue;

			host->headerFlags = 0;
			host->commandCount = 0;
			host->bufferCount = 1;
			host->packetSize = sizeof(ENetProtocolHeader);
			
			if (host->checksumCallback != NULL)
					host->packetSize += sizeof(enet_checksum);
				
			if (!enet_list_empty(&currentPeer->acknowledgements))
				enet_protocol_send_acknowledgements(host, currentPeer);

			if (checkForTimeouts != 0 && !enet_list_empty(&currentPeer->sentReliableCommands) && ENET_TIME_GREATER_EQUAL(host->serviceTime, currentPeer->nextTimeout) && enet_protocol_check_timeouts(host, currentPeer, event) == 1) {
				if (event != NULL && event->type != ENET_EVENT_TYPE_NONE)
					return 1;
				else
					continue;
			}

			if ((enet_list_empty(&currentPeer->outgoingCommands) || enet_protocol_check_outgoing_commands(host, currentPeer)) && enet_list_empty(&currentPeer->sentReliableCommands) && ENET_TIME_DIFFERENCE(host->serviceTime, currentPeer->lastReceiveTime) >= currentPeer->pingInterval && currentPeer->mtu - host->packetSize >= sizeof(ENetProtocolPing)) {
				enet_peer_ping(currentPeer);
				enet_protocol_check_outgoing_commands(host, currentPeer);
			}

			if (host->commandCount == 0)
				continue;

			host->buffers->data = headerData;

			if (host->headerFlags & ENET_PROTOCOL_HEADER_FLAG_SENT_TIME) {
				header->sentTime = ENET_HOST_TO_NET_16(host->serviceTime & 0xFFFF);
				host->buffers->dataLength = sizeof(ENetProtocolHeader);
			}
			else {
				host->buffers->dataLength = (size_t) & ((ENetProtocolHeader*)0)->sentTime;
			}

			if (currentPeer->outgoingPeerID < ENET_PROTOCOL_MAXIMUM_PEER_ID)
				host->headerFlags |= currentPeer->outgoingSessionID << ENET_PROTOCOL_HEADER_SESSION_SHIFT;

			header->peerID = ENET_HOST_TO_NET_16(currentPeer->outgoingPeerID | host->headerFlags);

			if (host->checksumCallback != NULL) {
				enet_checksum* checksum = (enet_checksum*)&headerData[host->buffers->dataLength];
				*checksum = currentPeer->outgoingPeerID < ENET_PROTOCOL_MAXIMUM_PEER_ID ? currentPeer->connectID : 0;
				host->buffers->dataLength += sizeof(enet_checksum);
				*checksum = host->checksumCallback(host->buffers, host->bufferCount);
			}

			currentPeer->lastSendTime = host->serviceTime;
			sentLength = enet_socket_send(host->socket, &currentPeer->address, host->buffers, host->bufferCount);

			enet_protocol_remove_sent_unreliable_commands(currentPeer);

			if (sentLength < 0)
				return -1;

			host->totalSentData += sentLength;
			currentPeer->totalDataSent += sentLength;
			host->totalSentPackets++;
		}
	}

	return 0;
}